

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_socket.c
# Opt level: O0

amqp_rpc_reply_t *
amqp_simple_rpc(amqp_connection_state_t state,amqp_channel_t channel,amqp_method_number_t request_id
               ,amqp_method_number_t *expected_reply_ids,void *decoded_request_method)

{
  amqp_status_enum status;
  amqp_rpc_reply_t *in_RDI;
  int res;
  amqp_time_t deadline;
  undefined2 in_stack_0000003c;
  amqp_connection_state_t in_stack_00000048;
  amqp_time_t in_stack_00000050;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  amqp_time_t *in_stack_ffffffffffffffd8;
  
  status = amqp_time_from_now(in_stack_ffffffffffffffd8,
                              (timeval *)
                              CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  if (status == AMQP_STATUS_OK) {
    simple_rpc_inner(in_stack_00000048,state._6_2_,(amqp_method_number_t)state,
                     (amqp_method_number_t *)
                     CONCAT26(channel,CONCAT24(in_stack_0000003c,request_id)),expected_reply_ids,
                     in_stack_00000050);
  }
  else {
    amqp_rpc_reply_error(in_RDI,status);
  }
  return in_RDI;
}

Assistant:

amqp_rpc_reply_t amqp_simple_rpc(amqp_connection_state_t state,
                                 amqp_channel_t channel,
                                 amqp_method_number_t request_id,
                                 amqp_method_number_t *expected_reply_ids,
                                 void *decoded_request_method) {
  amqp_time_t deadline;
  int res;

  res = amqp_time_from_now(&deadline, state->rpc_timeout);
  if (res != AMQP_STATUS_OK) {
    return amqp_rpc_reply_error(res);
  }

  return simple_rpc_inner(state, channel, request_id, expected_reply_ids,
                          decoded_request_method, deadline);
}